

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StockPileColliderTests.cpp
# Opt level: O0

void __thiscall
solitaire::colliders::StockPileColliderGetCoveredCardsPositionTests_getCoveredCardsPosition_Test::
~StockPileColliderGetCoveredCardsPositionTests_getCoveredCardsPosition_Test
          (StockPileColliderGetCoveredCardsPositionTests_getCoveredCardsPosition_Test *this)

{
  ~StockPileColliderGetCoveredCardsPositionTests_getCoveredCardsPosition_Test
            ((StockPileColliderGetCoveredCardsPositionTests_getCoveredCardsPosition_Test *)
             &this[-1].super_StockPileColliderGetCoveredCardsPositionTests.
              super_StockPileColliderTests.super_Test.gtest_flag_saver_);
  return;
}

Assistant:

TEST_P(StockPileColliderGetCoveredCardsPositionTests, getCoveredCardsPosition) {
    const auto& coveredCardsPositionData = GetParam();
    Cards cards {coveredCardsPositionData.cardsQuantity};
    EXPECT_CALL(stockPileMock, getCards()).WillOnce(ReturnRef(cards));
    EXPECT_CALL(stockPileMock, getSelectedCardIndex())
        .WillOnce(Return(coveredCardsPositionData.selectedCardIndex));

    EXPECT_EQ(
        collider.getCoveredCardsPosition(),
        coveredCardsPositionData.position
    );
}